

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O2

void runMusashi(Setup *s,Result *r)

{
  uint uVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  
  uVar1 = m68k_get_reg((void *)0x0,M68K_REG_PC);
  r->oldpc = uVar1;
  r->opcode = CONCAT11(musashiMem[uVar1 & 0xffff],musashiMem[uVar1 + 1 & 0xffff]);
  r->elapsed[0] = 0;
  r->elapsed[1] = 0;
  uVar1 = cpuModel + M68010;
  if (M68EC040 < cpuModel) {
    uVar1 = cpuModel == M68LC040 ^ 9;
  }
  cVar3 = clock();
  uVar1 = m68k_disassemble(r->dasmMusashi,s->pc,uVar1);
  r->dasmCntMusashi = uVar1;
  cVar4 = clock();
  r->elapsed[1] = cVar4 - cVar3;
  if (r->opcode < 0xf000) {
    cVar3 = clock();
    iVar2 = m68k_execute(1);
    r->cycles = iVar2;
    cVar4 = clock();
    r->elapsed[0] = cVar4 - cVar3;
    recordMusashiRegisters(r);
    return;
  }
  return;
}

Assistant:

void runMusashi(Setup &s, Result &r)
{
    r.oldpc = m68k_get_reg(NULL, M68K_REG_PC);
    r.opcode = get16(musashiMem, r.oldpc);
    r.elapsed[0] = r.elapsed[1] = 0;

    // Run the Musashi disassembler
    auto type =
    cpuModel == Model::M68000   ? M68K_CPU_TYPE_68000 :
    cpuModel == Model::M68010   ? M68K_CPU_TYPE_68010 :
    cpuModel == Model::M68EC020 ? M68K_CPU_TYPE_68EC020 :
    cpuModel == Model::M68020   ? M68K_CPU_TYPE_68020 :
    cpuModel == Model::M68EC030 ? M68K_CPU_TYPE_68EC030 :
    cpuModel == Model::M68030   ? M68K_CPU_TYPE_68030 :
    cpuModel == Model::M68EC040 ? M68K_CPU_TYPE_68EC040 :
    cpuModel == Model::M68LC040 ? M68K_CPU_TYPE_68LC040 : M68K_CPU_TYPE_68040;

    clock_t elapsed = clock();
    r.dasmCntMusashi = m68k_disassemble(r.dasmMusashi, s.pc, type);
    r.elapsed[1] = clock() - elapsed;

    if (VERBOSE) {
        printf("$%04x ($%04x): %s (Musashi)\n", r.oldpc, r.opcode, r.dasmMusashi);
    }

    // Run the Musashi CPU
    if (doExec(r.opcode)) {

        clock_t elapsed = clock();
        r.cycles = m68k_execute(1);
        r.elapsed[0] = clock() - elapsed;

        recordMusashiRegisters(r);
    }
}